

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devexpricing.hpp
# Opt level: O2

void __thiscall
DevexPricing::DevexPricing(DevexPricing *this,Runtime *rt,Basis *bas,ReducedCosts *rc)

{
  allocator_type local_9;
  value_type_conflict1 local_8;
  
  (this->super_Pricing)._vptr_Pricing = (_func_int **)&PTR_price_00433358;
  this->runtime = rt;
  this->basis = bas;
  this->redcosts = rc;
  local_8 = 1.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&this->weights,(long)(rt->instance).num_var,&local_8,&local_9);
  return;
}

Assistant:

DevexPricing(Runtime& rt, Basis& bas, ReducedCosts& rc)
      : runtime(rt),
        basis(bas),
        redcosts(rc),
        // clang-format off
        weights(std::vector<double>(rt.instance.num_var, 1.0)) {}